

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::appendChild(QMdiAreaPrivate *this,QMdiSubWindow *child)

{
  char *pcVar1;
  QWidget *parent;
  QWidgetData *pQVar2;
  QMdiAreaTabBar *this_00;
  bool bVar3;
  undefined8 uVar4;
  QSize QVar5;
  Placer *pPVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  Connection CStack_68;
  QObject local_60 [8];
  QString local_58;
  QIcon local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  parent = (this->super_QAbstractScrollAreaPrivate).viewport;
  if (*(QWidget **)(*(long *)&(child->super_QWidget).field_0x8 + 0x10) != parent) {
    QWidget::setParent(&child->super_QWidget,parent,
                       (WindowFlags)
                       (((child->super_QWidget).data)->window_flags).
                       super_QFlagsStorageHelper<Qt::WindowType,_4>.
                       super_QFlagsStorage<Qt::WindowType>.i);
  }
  if (child == (QMdiSubWindow *)0x0) {
    local_58.d.d._0_4_ = 0;
    local_58.d.d._4_4_ = 0;
  }
  else {
    local_58.d.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)child);
  }
  local_58.d.ptr = (char16_t *)child;
  QtPrivate::QMovableArrayOps<QPointer<QMdiSubWindow>>::emplace<QPointer<QMdiSubWindow>>
            ((QMovableArrayOps<QPointer<QMdiSubWindow>> *)&this->childWindows,
             (this->childWindows).d.size,(QPointer<QMdiSubWindow> *)&local_58);
  QList<QPointer<QMdiSubWindow>_>::end(&this->childWindows);
  if ((QSize)local_58.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
    UNLOCK();
    if ((*(int *)local_58.d.d == 0) && ((QSize)local_58.d.d != (QSize)0x0)) {
      operator_delete(local_58.d.d);
    }
  }
  bVar3 = QWidget::testAttribute_helper(&child->super_QWidget,WA_Resized);
  if ((!bVar3) && ((*(byte *)(*(long *)(pcVar1 + 0x20) + 9) & 0x80) != 0)) {
    uVar4 = (**(code **)(*(long *)&child->super_QWidget + 0x70))(child);
    pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    uVar8 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
    uVar10 = ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1;
    if ((int)(uint)uVar4 < (int)uVar8) {
      uVar8 = (uint)uVar4;
    }
    uVar7 = (uint)((ulong)uVar4 >> 0x20);
    if ((int)uVar7 < (int)uVar10) {
      uVar10 = uVar7;
    }
    QVar5 = qSmartMinSize(&child->super_QWidget);
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 <= QVar5.wd.m_i.m_i) {
      uVar9 = (ulong)QVar5 & 0xffffffff;
    }
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 <= QVar5.ht.m_i.m_i) {
      uVar11 = (ulong)QVar5 >> 0x20;
    }
    local_58.d.d = (Data *)(uVar9 | uVar11 << 0x20);
    QWidget::resize(&child->super_QWidget,(QSize *)&local_58);
  }
  if (this->placer == (Placer *)0x0) {
    pPVar6 = (Placer *)operator_new(8);
    pPVar6->_vptr_Placer = (_func_int **)&PTR_place_00803d10;
    this->placer = pPVar6;
  }
  place(this,this->placer,child);
  QMdiSubWindow::setOption
            (child,AllowOutsideAreaHorizontally,
             (this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff);
  QMdiSubWindow::setOption
            (child,AllowOutsideAreaVertically,
             (this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff);
  internalRaise(this,child);
  local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,(int)(this->childWindows).d.size + -1);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&this->indicesToActivatedChildren,0,(int *)&local_58);
  this_00 = this->tabBar;
  if (this_00 != (QMdiAreaTabBar *)0x0) {
    QWidget::windowIcon((QWidget *)&local_40);
    tabTextFor(&local_58,child);
    QTabBar::addTab(&this_00->super_QTabBar,&local_40,&local_58);
    if ((QSize)local_58.d.d != (QSize)0x0) {
      LOCK();
      *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
      UNLOCK();
      if (*(int *)local_58.d.d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_40);
    updateTabBarGeometry(this);
    if (((this->childWindows).d.size == 1) &&
       (((this->options).super_QFlagsStorageHelper<QMdiArea::AreaOption,_4>.
         super_QFlagsStorage<QMdiArea::AreaOption>.i & 1) == 0)) {
      this->showActiveWindowMaximized = true;
    }
  }
  if (((((child->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 0x12) == 0) {
    QWidget::setWindowFlags(&child->super_QWidget,(WindowFlags)0x12);
  }
  QObject::installEventFilter((QObject *)child);
  QObject::connect(local_60,(char *)child,(QObject *)"2aboutToActivate()",pcVar1,0x6e94ab);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect((QObject *)&CStack_68,(char *)child,
                   (QObject *)"2windowStateChanged(Qt::WindowStates,Qt::WindowStates)",pcVar1,
                   0x6e94fd);
  QMetaObject::Connection::~Connection(&CStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::appendChild(QMdiSubWindow *child)
{
    Q_Q(QMdiArea);
    Q_ASSERT(child && childWindows.indexOf(child) == -1);

    if (child->parent() != viewport)
        child->setParent(viewport, child->windowFlags());
    childWindows.append(QPointer<QMdiSubWindow>(child));

    if (!child->testAttribute(Qt::WA_Resized) && q->isVisible()) {
        QSize newSize(child->sizeHint().boundedTo(viewport->size()));
        child->resize(newSize.expandedTo(qSmartMinSize(child)));
    }

    if (!placer)
        placer = new MinOverlapPlacer;
    place(placer, child);

    if (hbarpolicy != Qt::ScrollBarAlwaysOff)
        child->setOption(QMdiSubWindow::AllowOutsideAreaHorizontally, true);
    else
        child->setOption(QMdiSubWindow::AllowOutsideAreaHorizontally, false);

    if (vbarpolicy != Qt::ScrollBarAlwaysOff)
        child->setOption(QMdiSubWindow::AllowOutsideAreaVertically, true);
    else
        child->setOption(QMdiSubWindow::AllowOutsideAreaVertically, false);

    internalRaise(child);
    indicesToActivatedChildren.prepend(childWindows.size() - 1);
    Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());

#if QT_CONFIG(tabbar)
    if (tabBar) {
        tabBar->addTab(child->windowIcon(), tabTextFor(child));
        updateTabBarGeometry();
        if (childWindows.size() == 1 && !(options & QMdiArea::DontMaximizeSubWindowOnActivation))
            showActiveWindowMaximized = true;
    }
#endif

    if (!(child->windowFlags() & Qt::SubWindow))
        child->setWindowFlags(Qt::SubWindow);
    child->installEventFilter(q);

    QObject::connect(child, SIGNAL(aboutToActivate()), q, SLOT(_q_deactivateAllWindows()));
    QObject::connect(child, SIGNAL(windowStateChanged(Qt::WindowStates,Qt::WindowStates)),
                     q, SLOT(_q_processWindowStateChanged(Qt::WindowStates,Qt::WindowStates)));
}